

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

ssize_t Curl_bufq_slurp(bufq *q,Curl_bufq_reader *reader,void *reader_ctx,CURLcode *err)

{
  buf_chunk *pbVar1;
  ssize_t sVar2;
  long lVar3;
  
  *err = CURLE_AGAIN;
  lVar3 = 0;
  while( true ) {
    sVar2 = Curl_bufq_sipn(q,0,reader,reader_ctx,err);
    if (sVar2 < 0) break;
    if (sVar2 == 0) goto LAB_00112a7e;
    lVar3 = sVar2 + lVar3;
    pbVar1 = q->tail;
    if ((pbVar1 != (buf_chunk *)0x0) && (pbVar1->w_offset < pbVar1->dlen)) {
      return lVar3;
    }
  }
  if (lVar3 == 0) {
    return -1;
  }
  if (*err != CURLE_AGAIN) {
    return -1;
  }
LAB_00112a7e:
  *err = CURLE_OK;
  return lVar3;
}

Assistant:

ssize_t Curl_bufq_slurp(struct bufq *q, Curl_bufq_reader *reader,
                        void *reader_ctx, CURLcode *err)
{
  return bufq_slurpn(q, 0, reader, reader_ctx, err);
}